

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<kj::File,_std::nullptr_t> __thiscall kj::newMemfdFile(kj *this,uint flags)

{
  int osErrorNumber;
  File *extraout_RDX;
  Own<kj::File,_std::nullptr_t> OVar1;
  Fault f;
  OwnFd local_2c;
  Fault local_28;
  
  do {
    local_2c.fd = memfd_create("kj-memfd",flags | 1);
    if (-1 < local_2c.fd) goto LAB_001d55cf;
    osErrorNumber = _::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    _::Debug::Fault::Fault
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x732,osErrorNumber,"_kj_fd = memfd_create(\"kj-memfd\", flags | 1U)","");
    _::Debug::Fault::fatal(&local_28);
  }
LAB_001d55cf:
  newDiskFile(this,&local_2c);
  OwnFd::~OwnFd(&local_2c);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<File> newMemfdFile(uint flags) {
  return newDiskFile(KJ_SYSCALL_FD(memfd_create("kj-memfd", flags | MFD_CLOEXEC)));
}